

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O2

void __thiscall iDynTree::Traversal::~Traversal(Traversal *this)

{
  reset(this,0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->linkIndexToTraversalIndex).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>::
  ~_Vector_base(&(this->toParentJoints).
                 super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
               );
  std::_Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::~_Vector_base
            (&(this->parents).
              super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>);
  std::_Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::~_Vector_base
            ((_Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_> *)this);
  return;
}

Assistant:

Traversal::~Traversal()
{
    reset(0);
}